

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall
Joint::setall_deg_(Joint *this,double j1,double j2,double j3,double j4,double j5,double j6)

{
  double j6_local;
  double j5_local;
  double j4_local;
  double j3_local;
  double j2_local;
  double j1_local;
  Joint *this_local;
  
  this->j1 = j1 * 0.017453292519943295;
  this->j2 = j2 * 0.017453292519943295;
  this->j3 = j3 * 0.017453292519943295;
  this->j4 = j4 * 0.017453292519943295;
  this->j5 = j5 * 0.017453292519943295;
  this->j6 = j6 * 0.017453292519943295;
  return;
}

Assistant:

void Joint::setall_deg_(double j1, double j2, double j3, double j4, double j5, double j6){
      this->j1 = j1 * (M_PI / 180.0);
      this->j2 = j2 * (M_PI / 180.0);
      this->j3 = j3 * (M_PI / 180.0);
      this->j4 = j4 * (M_PI / 180.0);
      this->j5 = j5 * (M_PI / 180.0);
      this->j6 = j6 * (M_PI / 180.0);
}